

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgResetGroup(Abc_TgMan_t *pMan)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char pPermNew [16];
  char acStack_28 [16];
  
  iVar2 = pMan->nGVars;
  if (1 < (long)iVar2) {
    lVar3 = 1;
    iVar4 = 2;
    do {
      cVar1 = pMan->pPerm[lVar3];
      iVar5 = iVar4;
      do {
        uVar6 = iVar5 - 1;
        if (pMan->pPerm[(ulong)uVar6 - 1] <= cVar1) goto LAB_0050512b;
        pMan->pPerm[uVar6] = pMan->pPerm[(ulong)uVar6 - 1];
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
      uVar6 = 0;
LAB_0050512b:
      pMan->pPerm[(int)uVar6] = cVar1;
      lVar3 = lVar3 + 1;
      iVar4 = iVar4 + 1;
    } while (lVar3 != iVar2);
  }
  Abc_TgExpendSymmetry(pMan,acStack_28);
  Abc_TgImplementPerm(pMan,acStack_28);
  pMan->fPhased = 0;
  pMan->nGroups = 1;
  pMan->pGroup[0].nGVars = (char)iVar2;
  pMan->vPhase->nSize = 0;
  return;
}

Assistant:

static void Abc_TgResetGroup(Abc_TgMan_t * pMan)
{
    int i, j;
    char * pPerm = pMan->pPerm;
    char pPermNew[16];
    int nGVars = pMan->nGVars;
    for (i = 1; i < nGVars; i++)
    {
        char t = pPerm[i];
        for (j = i; j > 0 && pPerm[j - 1] > t; j--)
            pPerm[j] = pPerm[j - 1];
        pPerm[j] = t;
    }
    Abc_TgExpendSymmetry(pMan, pPermNew);
    Abc_TgImplementPerm(pMan, pPermNew);
    pMan->fPhased = 0;
    pMan->nGroups = 1;
    pMan->pGroup->nGVars = nGVars;
    Vec_IntClear(pMan->vPhase);
}